

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O0

void shuffle_filter_odd_ssse3(int16_t *filter,__m128i *f)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __m128i alVar8;
  __m128i f_values;
  __m128i *f_local;
  int16_t *filter_local;
  
  auVar7 = *(undefined1 (*) [16])filter;
  auVar6 = *(undefined1 (*) [16])filter;
  auVar2 = *(undefined1 (*) [16])filter;
  auVar1 = *(undefined1 (*) [16])filter;
  auVar5._8_8_ = 0x7000700070007;
  auVar5._0_8_ = 0x7000700070007;
  alVar8 = (__m128i)pshufb(*(undefined1 (*) [16])filter,auVar5);
  *f = alVar8;
  auVar4._8_8_ = 0x402040204020402;
  auVar4._0_8_ = 0x402040204020402;
  alVar8 = (__m128i)pshufb(auVar1,auVar4);
  f[1] = alVar8;
  auVar3._8_8_ = 0x806080608060806;
  auVar3._0_8_ = 0x806080608060806;
  alVar8 = (__m128i)pshufb(auVar2,auVar3);
  f[2] = alVar8;
  auVar2._8_8_ = 0xc0a0c0a0c0a0c0a;
  auVar2._0_8_ = 0xc0a0c0a0c0a0c0a;
  alVar8 = (__m128i)pshufb(auVar6,auVar2);
  f[3] = alVar8;
  auVar1._8_8_ = 0x70e070e070e070e;
  auVar1._0_8_ = 0x70e070e070e070e;
  alVar8 = (__m128i)pshufb(auVar7,auVar1);
  f[4] = alVar8;
  return;
}

Assistant:

static inline void shuffle_filter_odd_ssse3(const int16_t *const filter,
                                            __m128i *const f) {
  const __m128i f_values = _mm_load_si128((const __m128i *)filter);
  // pack and duplicate the filter values
  // It utilizes the fact that the high byte of filter[3] is always 0 to clean
  // half of f[0] and f[4].
  assert(filter[3] >= 0 && filter[3] < 256);
  f[0] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0007u));
  f[1] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0402u));
  f[2] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0806u));
  f[3] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x0c0au));
  f[4] = _mm_shuffle_epi8(f_values, _mm_set1_epi16(0x070eu));
}